

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_CreateDoubleArray(double *numbers,int count)

{
  cJSON *item;
  cJSON *a;
  cJSON *p;
  cJSON *n;
  size_t i;
  int count_local;
  double *numbers_local;
  
  p = (cJSON *)0x0;
  if ((count < 0) || (numbers == (double *)0x0)) {
    numbers_local = (double *)0x0;
  }
  else {
    numbers_local = (double *)cJSON_CreateArray();
    for (n = (cJSON *)0x0; (cJSON *)numbers_local != (cJSON *)0x0 && n < (cJSON *)(long)count;
        n = (cJSON *)((long)&n->next + 1)) {
      item = cJSON_CreateNumber(numbers[(long)n]);
      if (item == (cJSON *)0x0) {
        cJSON_Delete((cJSON *)numbers_local);
        return (cJSON *)0x0;
      }
      if (n == (cJSON *)0x0) {
        ((cJSON *)numbers_local)->child = item;
      }
      else {
        suffix_object(p,item);
      }
      p = item;
    }
    if (((cJSON *)numbers_local != (cJSON *)0x0) &&
       (((cJSON *)numbers_local)->child != (cJSON *)0x0)) {
      ((cJSON *)numbers_local)->child->prev = p;
    }
  }
  return (cJSON *)numbers_local;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_CreateDoubleArray(const double *numbers, int count)
{
    size_t i = 0;
    cJSON *n = NULL;
    cJSON *p = NULL;
    cJSON *a = NULL;

    if ((count < 0) || (numbers == NULL))
    {
        return NULL;
    }

    a = cJSON_CreateArray();

    for(i = 0; a && (i < (size_t)count); i++)
    {
        n = cJSON_CreateNumber(numbers[i]);
        if(!n)
        {
            cJSON_Delete(a);
            return NULL;
        }
        if(!i)
        {
            a->child = n;
        }
        else
        {
            suffix_object(p, n);
        }
        p = n;
    }

    if (a && a->child) {
        a->child->prev = n;
    }

    return a;
}